

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

unsigned_long_long ZSTD_decompressBound(void *src,size_t srcSize)

{
  uint uVar1;
  ZSTD_frameSizeInfo ZVar2;
  unsigned_long_long decompressedBound;
  size_t compressedSize;
  ZSTD_frameSizeInfo frameSizeInfo;
  unsigned_long_long bound;
  size_t srcSize_local;
  void *src_local;
  
  frameSizeInfo.decompressedBound = 0;
  bound = srcSize;
  srcSize_local = (size_t)src;
  while( true ) {
    if (bound == 0) {
      return frameSizeInfo.decompressedBound;
    }
    ZVar2 = ZSTD_findFrameSizeInfo((void *)srcSize_local,bound);
    compressedSize = ZVar2.compressedSize;
    frameSizeInfo.compressedSize = ZVar2.decompressedBound;
    uVar1 = ERR_isError(compressedSize);
    if ((uVar1 != 0) || (frameSizeInfo.compressedSize == 0xfffffffffffffffe)) break;
    srcSize_local = srcSize_local + compressedSize;
    bound = bound - compressedSize;
    frameSizeInfo.decompressedBound = frameSizeInfo.compressedSize + frameSizeInfo.decompressedBound
    ;
  }
  return 0xfffffffffffffffe;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}